

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubwordLearner.cc
# Opt level: O1

void __thiscall
onmt::SubwordLearner::SubwordLearner(SubwordLearner *this,bool verbose,Tokenizer *default_tokenizer)

{
  Tokenizer *this_00;
  string local_70;
  string local_50;
  
  this->_vptr_SubwordLearner = (_func_int **)&PTR__SubwordLearner_00380f98;
  this->_verbose = verbose;
  this_00 = default_tokenizer;
  if (default_tokenizer == (Tokenizer *)0x0) {
    this_00 = (Tokenizer *)operator_new(0xc0);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
    Tokenizer::Tokenizer
              (this_00,None,0x100,&local_50,(string *)&Tokenizer::joiner_marker_abi_cxx11_,&local_70
               ,0x32);
  }
  (this->_default_tokenizer).super___shared_ptr<const_onmt::Tokenizer,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<onmt::Tokenizer_const*>
            (&(this->_default_tokenizer).
              super___shared_ptr<const_onmt::Tokenizer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             this_00);
  if (default_tokenizer == (Tokenizer *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

SubwordLearner::SubwordLearner(bool verbose, const Tokenizer* default_tokenizer)
    : _verbose(verbose)
    , _default_tokenizer(default_tokenizer
                         ? default_tokenizer
                         : new Tokenizer(Tokenizer::Mode::None, Tokenizer::Flags::NoSubstitution))
  {
  }